

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O0

int dwarf_get_fde_augmentation_data
              (Dwarf_Fde_conflict fde,Dwarf_Small **augdata,Dwarf_Unsigned *augdata_len,
              Dwarf_Error *error)

{
  Dwarf_Cie_conflict cie;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *augdata_len_local;
  Dwarf_Small **augdata_local;
  Dwarf_Fde_conflict fde_local;
  
  if (fde == (Dwarf_Fde_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x5c);
    fde_local._4_4_ = 1;
  }
  else if (fde->fd_gnu_eh_aug_present == 0) {
    fde_local._4_4_ = -1;
  }
  else if (fde->fd_cie == (Dwarf_Cie_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x5e);
    fde_local._4_4_ = 1;
  }
  else {
    *augdata = (Dwarf_Small *)fde->fd_gnu_eh_augmentation_bytes;
    *augdata_len = fde->fd_gnu_eh_augmentation_len;
    fde_local._4_4_ = 0;
  }
  return fde_local._4_4_;
}

Assistant:

int
dwarf_get_fde_augmentation_data(Dwarf_Fde fde,
    Dwarf_Small * *augdata,
    Dwarf_Unsigned * augdata_len,
    Dwarf_Error * error)
{
    Dwarf_Cie cie = 0;

    if (fde == NULL) {
        _dwarf_error(NULL, error, DW_DLE_FDE_NULL);
        return DW_DLV_ERROR;
    }
    if (!fde->fd_gnu_eh_aug_present) {
        return DW_DLV_NO_ENTRY;
    }
    cie = fde->fd_cie;
    if (cie == NULL) {
        _dwarf_error(NULL, error, DW_DLE_CIE_NULL);
        return DW_DLV_ERROR;
    }
    *augdata = (Dwarf_Small *) fde->fd_gnu_eh_augmentation_bytes;
    *augdata_len = fde->fd_gnu_eh_augmentation_len;
    return DW_DLV_OK;
}